

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

bool __thiscall
Reducer::tryToRemoveFunctions(Reducer *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *names)

{
  pointer pNVar1;
  bool bVar2;
  byte bVar3;
  reference pNVar4;
  pointer pMVar5;
  type pMVar6;
  ostream *poVar7;
  size_type sVar8;
  Name NVar9;
  bool local_1ba;
  undefined1 local_18d [13];
  undefined1 local_180 [8];
  FunctionReferenceRemover referenceRemover;
  Name name;
  iterator __end1;
  iterator __begin1;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range1;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *names_local;
  Reducer *this_local;
  
  __end1 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(names);
  name.super_IString.str._M_str =
       (char *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end(names);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                     *)&name.super_IString.str._M_str), bVar2) {
    pNVar4 = __gnu_cxx::
             __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
             ::operator*(&__end1);
    pNVar1 = (pointer)(pNVar4->super_IString).str._M_len;
    name.super_IString.str._M_len = (size_t)(pNVar4->super_IString).str._M_str;
    pMVar5 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                       (&this->module);
    NVar9.super_IString.str._M_str = (char *)pNVar1;
    NVar9.super_IString.str._M_len = (size_t)pMVar5;
    referenceRemover.exportsToRemove.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pNVar1;
    wasm::Module::removeFunction(NVar9);
    __gnu_cxx::
    __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
    operator++(&__end1);
  }
  tryToRemoveFunctions(std::vector<wasm::Name,std::allocator<wasm::Name>>)::FunctionReferenceRemover
  ::FunctionReferenceRemover(std::vector<wasm::Name,std::allocator<wasm::Name>_>__
            ((Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_> *)
             local_180,names);
  pMVar5 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::get(&this->module);
  wasm::Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>::walkModule
            ((Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_> *)
             local_180,pMVar5);
  pMVar6 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator*
                     (&this->module);
  bVar3 = wasm::WasmValidator::validate((Module *)local_18d,(uint)pMVar6);
  local_1ba = false;
  if ((bVar3 & 1) != 0) {
    local_1ba = writeAndTestReduction(this);
  }
  if (local_1ba != false) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"|        removed ");
    sVar8 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(names);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar8);
    std::operator<<(poVar7," functions\n");
  }
  else {
    loadWorking(this);
  }
  tryToRemoveFunctions::FunctionReferenceRemover::~FunctionReferenceRemover
            ((FunctionReferenceRemover *)local_180);
  return local_1ba != false;
}

Assistant:

bool tryToRemoveFunctions(std::vector<Name> names) {
    for (auto name : names) {
      module->removeFunction(name);
    }

    // remove all references to them
    struct FunctionReferenceRemover
      : public PostWalker<FunctionReferenceRemover> {
      std::unordered_set<Name> names;
      std::vector<Name> exportsToRemove;

      FunctionReferenceRemover(std::vector<Name>& vec) {
        for (auto name : vec) {
          names.insert(name);
        }
      }
      void visitCall(Call* curr) {
        if (names.count(curr->target)) {
          replaceCurrent(Builder(*getModule()).replaceWithIdenticalType(curr));
        }
      }
      void visitRefFunc(RefFunc* curr) {
        if (names.count(curr->func)) {
          replaceCurrent(Builder(*getModule()).replaceWithIdenticalType(curr));
        }
      }
      void visitExport(Export* curr) {
        if (auto* name = curr->getInternalName(); name && names.count(*name)) {
          exportsToRemove.push_back(curr->name);
        }
      }
      void doWalkModule(Module* module) {
        PostWalker<FunctionReferenceRemover>::doWalkModule(module);
        for (auto name : exportsToRemove) {
          module->removeExport(name);
        }
      }
    };
    FunctionReferenceRemover referenceRemover(names);
    referenceRemover.walkModule(module.get());

    if (WasmValidator().validate(
          *module, WasmValidator::Globally | WasmValidator::Quiet) &&
        writeAndTestReduction()) {
      std::cerr << "|        removed " << names.size() << " functions\n";
      return true;
    } else {
      loadWorking(); // restore it from orbit
      return false;
    }
  }